

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxylogger.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ILogger *pIVar1;
  MyClass *in_RSI;
  MyClass C;
  LogStdout *in_stack_ffffffffffffffb0;
  MyClass *this;
  MyClass local_40;
  
  pIVar1 = (ILogger *)operator_new(8);
  liblogger::LogStdout::LogStdout(in_stack_ffffffffffffffb0);
  liblogger::LogManager::Add(pIVar1);
  this = &local_40;
  MyClass::MyClass(in_RSI);
  MyClass::Test(this);
  liblogger::LogManager::RemoveAll();
  MyClass::~MyClass((MyClass *)0x1023af);
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
	LogManager::Add(new LogStdout());

    MyClass C;
    C.Test();

	LogManager::RemoveAll();
	return 0;
}